

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::SingularFieldHelper<6>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  uint8 *puVar1;
  
  WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
  puVar1 = output->ptr;
  *(undefined8 *)puVar1 = *field;
  output->ptr = puVar1 + 8;
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    WriteTagTo(md.tag, output);
    SerializeTo<type>(field, output);
  }